

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvastrscan.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint __sig;
  uint uStack_4803c;
  uint uStack_48038;
  int ctr;
  int l;
  int pos;
  int i;
  int z;
  uint32_t tab [12288] [6];
  uint local_20;
  int k;
  int j;
  int c;
  char **argv_local;
  int argc_local;
  
  iVar1 = nva_init();
  if (iVar1 == 0) {
    while (iVar1 = getopt(argc,argv,"c:"), iVar1 != -1) {
      if (iVar1 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    }
    if (cnum < nva_cardsnum) {
      nv50_graph_reset();
      nva_wr32(cnum,0x1700,0x400);
      nva_wr32(cnum,0x700020,0x190000);
      nva_wr32(cnum,0x700024,0x4080000);
      nva_wr32(cnum,0x700028,0x4010000);
      nva_wr32(cnum,0x70002c,0);
      nva_wr32(cnum,0x700030,0);
      nva_wr32(cnum,0x700034,0x10000);
      nva_wr32(cnum,0x700200,0x190000);
      nva_wr32(cnum,0x700204,0x4080000);
      nva_wr32(cnum,0x700208,0x4010000);
      nva_wr32(cnum,0x70020c,0);
      nva_wr32(cnum,0x700210,0);
      nva_wr32(cnum,0x700214,0x10000);
      for (local_20 = 0; (int)local_20 < 0x10; local_20 = local_20 + 1) {
        __sig = local_20;
        printf("Strand %d!\n");
        kill(local_20,__sig);
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000; tab[0x2fff][5] = tab[0x2fff][5] + 4)
        {
          nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0xdeafbeef);
        }
        strread(local_20,0);
        for (tab[0x2fff][5] = (local_20 & 7) << 2; (int)tab[0x2fff][5] < 0x60000;
            tab[0x2fff][5] = tab[0x2fff][5] + 0x20) {
          uVar2 = nva_rd32(cnum,tab[0x2fff][5] + 0x710000);
          (&i)[(long)((int)tab[0x2fff][5] / 0x20) * 6] = uVar2;
        }
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000; tab[0x2fff][5] = tab[0x2fff][5] + 4)
        {
          nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0);
        }
        strwrite(local_20,0);
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000; tab[0x2fff][5] = tab[0x2fff][5] + 4)
        {
          nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0);
        }
        strread(local_20,0);
        for (tab[0x2fff][5] = (local_20 & 7) << 2; (int)tab[0x2fff][5] < 0x60000;
            tab[0x2fff][5] = tab[0x2fff][5] + 0x20) {
          uVar2 = nva_rd32(cnum,tab[0x2fff][5] + 0x710000);
          tab[(long)((int)tab[0x2fff][5] / 0x20) + -1][5] = uVar2;
        }
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000; tab[0x2fff][5] = tab[0x2fff][5] + 4)
        {
          nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0xffffffff);
        }
        strwrite(local_20,0);
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000; tab[0x2fff][5] = tab[0x2fff][5] + 4)
        {
          nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0);
        }
        strread(local_20,0);
        for (tab[0x2fff][5] = (local_20 & 7) << 2; (int)tab[0x2fff][5] < 0x60000;
            tab[0x2fff][5] = tab[0x2fff][5] + 0x20) {
          uVar2 = nva_rd32(cnum,tab[0x2fff][5] + 0x710000);
          tab[(int)tab[0x2fff][5] / 0x20][0] = uVar2;
        }
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000; tab[0x2fff][5] = tab[0x2fff][5] + 4)
        {
          nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0);
        }
        strwrite(local_20,8);
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000; tab[0x2fff][5] = tab[0x2fff][5] + 4)
        {
          nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0);
        }
        strread(local_20,8);
        for (tab[0x2fff][5] = (local_20 & 7) << 2; (int)tab[0x2fff][5] < 0x60000;
            tab[0x2fff][5] = tab[0x2fff][5] + 0x20) {
          uVar2 = nva_rd32(cnum,tab[0x2fff][5] + 0x710000);
          tab[(int)tab[0x2fff][5] / 0x20][1] = uVar2;
        }
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000; tab[0x2fff][5] = tab[0x2fff][5] + 4)
        {
          nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0xffffffff);
        }
        strwrite(local_20,8);
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000; tab[0x2fff][5] = tab[0x2fff][5] + 4)
        {
          nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0);
        }
        strread(local_20,8);
        for (tab[0x2fff][5] = (local_20 & 7) << 2; (int)tab[0x2fff][5] < 0x60000;
            tab[0x2fff][5] = tab[0x2fff][5] + 0x20) {
          uVar2 = nva_rd32(cnum,tab[0x2fff][5] + 0x710000);
          tab[(int)tab[0x2fff][5] / 0x20][2] = uVar2;
          tab[(int)tab[0x2fff][5] / 0x20][3] = 0;
        }
        for (pos = 0; pos < 0x20; pos = pos + 1) {
          for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000;
              tab[0x2fff][5] = tab[0x2fff][5] + 4) {
            nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0xffffffff);
          }
          strwrite(local_20,8);
          nva_wr32(cnum,0x400040,1 << ((byte)pos & 0x1f));
          nva_wr32(cnum,0x400040,0);
          strwait();
          for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000;
              tab[0x2fff][5] = tab[0x2fff][5] + 4) {
            nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0);
          }
          strread(local_20,8);
          for (tab[0x2fff][5] = (local_20 & 7) << 2; (int)tab[0x2fff][5] < 0x60000;
              tab[0x2fff][5] = tab[0x2fff][5] + 0x20) {
            uVar2 = tab[(int)tab[0x2fff][5] / 0x20][2];
            uVar3 = nva_rd32(cnum,tab[0x2fff][5] + 0x710000);
            if (uVar2 != uVar3) {
              tab[(int)tab[0x2fff][5] / 0x20][3] =
                   1 << ((byte)pos & 0x1f) | tab[(int)tab[0x2fff][5] / 0x20][3];
            }
          }
        }
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x3000; tab[0x2fff][5] = tab[0x2fff][5] + 1)
        {
          if (((&i)[(long)(int)tab[0x2fff][5] * 6] == -0x21504111) &&
             (tab[(int)tab[0x2fff][5]][2] == 0)) {
            slen[(int)local_20] = tab[0x2fff][5];
            break;
          }
        }
        if (slen[(int)local_20] != 0) {
          printf("Initial length: %04x\n",(ulong)(uint)slen[(int)local_20]);
          while (slen[(int)local_20] != 0) {
            for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000;
                tab[0x2fff][5] = tab[0x2fff][5] + 4) {
              nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0);
            }
            nva_wr32(cnum,(local_20 & 7) * 4 + 0x710000 + (slen[(int)local_20] + -1) * 0x20,
                     0xffffffff);
            strwrite(local_20,8);
            for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000;
                tab[0x2fff][5] = tab[0x2fff][5] + 4) {
              nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0);
            }
            strread(local_20,8);
            uVar2 = nva_rd32(cnum,(local_20 & 7) * 4 + 0x710000 + (slen[(int)local_20] + -1) * 0x20)
            ;
            if (uVar2 != 0) break;
            slen[(int)local_20] = slen[(int)local_20] + -1;
          }
        }
        printf("Length: %04x\n",(ulong)(uint)slen[(int)local_20]);
        for (l = 0; l < 0x400; l = l + 1) {
          ctr = -1;
          uStack_4803c = 0;
          for (uStack_48038 = 1; (int)uStack_48038 < 0x14; uStack_48038 = uStack_48038 + 1) {
            for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000;
                tab[0x2fff][5] = tab[0x2fff][5] + 4) {
              nva_wr32(cnum,tab[0x2fff][5] + 0x710000,0);
            }
            strwrite(local_20,8);
            for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < (int)uStack_48038;
                tab[0x2fff][5] = tab[0x2fff][5] + 1) {
              nva_wr32(cnum,tab[0x2fff][5] * 4 + 0x400420,0xffffffff);
            }
            nva_wr32(cnum,0x400408,l << 0x10);
            nva_wr32(cnum,0x400404,
                     (local_20 & 7) << 8 | 0x30000 | (local_20 & 8) << 9 | uStack_48038);
            strwait();
            strread(local_20,8);
            uStack_4803c = 0;
            ctr = -1;
            for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < 0x70000;
                tab[0x2fff][5] = tab[0x2fff][5] + 4) {
              uVar2 = nva_rd32(cnum,tab[0x2fff][5] + 0x710000);
              if ((uVar2 != 0) && ((tab[0x2fff][5] & 0x1c) == (local_20 & 7) << 2)) {
                if (ctr == -1) {
                  ctr = (int)tab[0x2fff][5] / 0x20;
                }
                uStack_4803c = uStack_4803c + 1;
              }
            }
            if (((int)uStack_4803c <= (int)uStack_48038) && (uStack_4803c != 0)) break;
          }
          if (ctr == -1) {
            seekcnt[(int)local_20] = l;
            break;
          }
          if (uStack_4803c != uStack_48038) {
            __assert_fail("ctr == l",
                          "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/nva/nvastrscan.c"
                          ,0x106,"int main(int, char **)");
          }
          printf("SEEK: %04x [%d/%d]...\n",(ulong)(uint)ctr,(ulong)uStack_4803c,(ulong)uStack_48038)
          ;
          seekstart[(int)local_20][l] = ctr;
          seeksize[(int)local_20][l] = uStack_48038;
        }
        l = 0;
        for (tab[0x2fff][5] = 0; (int)tab[0x2fff][5] < slen[(int)local_20];
            tab[0x2fff][5] = tab[0x2fff][5] + 1) {
          if ((l < seekcnt[(int)local_20]) && (tab[0x2fff][5] == seekstart[(int)local_20][l])) {
            printf("\nSEEK %03x [unit %x]\n",(ulong)(uint)l,(ulong)(uint)seeksize[(int)local_20][l])
            ;
            l = l + 1;
          }
          else if ((l != 0) &&
                  ((seeksize[(int)local_20][l + -1] != 1 &&
                   ((int)(tab[0x2fff][5] - seekstart[(int)local_20][l + -1]) %
                    seeksize[(int)local_20][l + -1] == 0)))) {
            printf("\n");
          }
          printf("%04x: %08x %08x %08x %08x %08x %08x\n",(ulong)tab[0x2fff][5],
                 (ulong)(uint)(&i)[(long)(int)tab[0x2fff][5] * 6],
                 (ulong)tab[(long)(int)tab[0x2fff][5] + -1][5],(ulong)tab[(int)tab[0x2fff][5]][0],
                 (ulong)tab[(int)tab[0x2fff][5]][1],tab[(int)tab[0x2fff][5]][2],
                 tab[(int)tab[0x2fff][5]][3]);
        }
      }
      argv_local._4_4_ = 0;
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv){
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	nv50_graph_reset();
	nva_wr32(cnum, 0x1700, 0x400);
	nva_wr32(cnum, 0x700020, 0x190000);
	nva_wr32(cnum, 0x700024, 0x4000000 + 0x80000);
	nva_wr32(cnum, 0x700028, 0x4000000 + 0x10000);
	nva_wr32(cnum, 0x70002c, 0);
	nva_wr32(cnum, 0x700030, 0);
	nva_wr32(cnum, 0x700034, 0x10000);
	nva_wr32(cnum, 0x700200, 0x190000);
	nva_wr32(cnum, 0x700204, 0x4000000 + 0x80000);
	nva_wr32(cnum, 0x700208, 0x4000000 + 0x10000);
	nva_wr32(cnum, 0x70020c, 0);
	nva_wr32(cnum, 0x700210, 0);
	nva_wr32(cnum, 0x700214, 0x10000);

	int j;
	int k;

	for (j = 0; j < 16; j++) {
		printf ("Strand %d!\n", j);
		uint32_t tab[0x3000][6];
		kill(j);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0xdeafbeef);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][0] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strwrite(j, 0);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][1] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, -1);
		strwrite(j, 0);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][2] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strwrite(j, 8);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 8);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][3] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, -1);
		strwrite(j, 8);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 8);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][4] = nva_rd32(cnum, 0x710000 + k);
			tab[k/32][5] = 0;
		}

		int z;
		for (z = 0; z < 32; z++) {
			for (k = 0; k < 0x70000; k += 4)
				nva_wr32(cnum, 0x710000 + k, -1);
			strwrite(j, 8);
			nva_wr32(cnum, 0x400040, 1 << z);
			nva_wr32(cnum, 0x400040, 0);
			strwait();
			for (k = 0; k < 0x70000; k += 4)
				nva_wr32(cnum, 0x710000 + k, 0);
			strread(j, 8);
			for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
				if (tab[k/32][4] != nva_rd32(cnum, 0x710000 + k))
					tab[k/32][5] |= 1 << z;
			}
		}

		for (k = 0; k < 0x3000; k++)
			if (tab[k][0] == 0xdeafbeef && !tab[k][4]) {
				slen[j] = k;
				break;
			}

		if (slen[j]) {
			printf ("Initial length: %04x\n", slen[j]);
			while (slen[j]) {
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				nva_wr32(cnum, 0x710000 + (j&7)*4 + (slen[j] - 1) * 32, 0xffffffff);
				strwrite(j, 8);
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				strread(j, 8);
				if (nva_rd32(cnum, 0x710000 + (j&7)*4 + (slen[j] - 1) * 32)) {
					break;
				} else {
					slen[j]--;
				}
			}
		}
		printf ("Length: %04x\n", slen[j]);

		int i;
		for (i = 0; i < 0x400; i++) {
			int pos = -1;
			int l;
			int ctr = 0;
//			int try;
			for (l = 1; l < 0x14; l++) {
//				try = 0;
//respin:
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				strwrite(j, 8);
				for (k = 0; k < l; k++)
					nva_wr32(cnum, 0x400420 + k * 4, 0xffffffff);
				nva_wr32(cnum, 0x400408, i << 16);
				nva_wr32(cnum, 0x400404, 0x30000 | (j & 7) << 8 | (j&8) << (12-3) | l);
				strwait();
				strread(j, 8);
				ctr = 0;
				pos = -1;
				for (k = 0; k < 0x70000; k += 4)
					if (nva_rd32(cnum, 0x710000 + k) && (k & 0x1c) == (j & 7) << 2) {
						if (pos == -1)
							pos = k / 32;
						ctr++;
//						printf ("%04x: %08x\n", k/32, nva_rd32(cnum, 0x710000 + k));
					}
				if (ctr <= l && ctr)
					break;
//				else
//					if (try++ < 4)
//						goto respin;
			}
			if (pos == -1) {
				seekcnt[j] = i;
				break;
			}
			assert(ctr == l);
			printf ("SEEK: %04x [%d/%d]...\n", pos, ctr, l);
			seekstart[j][i] = pos;
			seeksize[j][i] = l;
		}

		i = 0;
		for (k = 0; k < slen[j]; k++) {
			if (i < seekcnt[j] && k == seekstart[j][i]) {
				printf ("\nSEEK %03x [unit %x]\n", i, seeksize[j][i]);
				i++;
			} else if (i && seeksize[j][i-1] != 1 && !((k - seekstart[j][i-1])%seeksize[j][i-1]))
				printf ("\n");
			printf ("%04x: %08x %08x %08x %08x %08x %08x\n", k, tab[k][0], tab[k][1], tab[k][2], tab[k][3], tab[k][4], tab[k][5]);
		}
	}


	return 0;
}